

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# request.cc
# Opt level: O0

void __thiscall iqxmlrpc::Request::Request(Request *this,string *name_,Param_list *params_)

{
  Param_list *params__local;
  string *name__local;
  Request *this_local;
  
  std::__cxx11::string::string((string *)this,(string *)name_);
  std::vector<iqxmlrpc::Value,_std::allocator<iqxmlrpc::Value>_>::vector(&this->params,params_);
  return;
}

Assistant:

Request::Request( const std::string& name_, const Param_list& params_ ):
  name(name_),
  params(params_)
{
}